

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::UpdateClipRect(ImDrawList *this)

{
  ImTextureID pvVar1;
  ImDrawList *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [11];
  undefined1 auVar7 [11];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  ImVector<ImDrawCmd> *in_RDI;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  byte bVar35;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  ImVec4 curr_clip_rect;
  ImTextureID local_58;
  ImDrawCmd *local_48;
  ImDrawCmd *local_40;
  ImTextureID *local_38;
  char local_18;
  char cStackY_17;
  char cStackY_16;
  char cStackY_15;
  char cStackY_14;
  char cStackY_13;
  char cStackY_12;
  char cStackY_11;
  char cVar36;
  
  if (in_RDI[6].Size == 0) {
    local_38 = &(in_RDI[3].Data)->TextureId;
  }
  else {
    local_38 = (ImTextureID *)(&(in_RDI[6].Data)->ElemCount + (long)(in_RDI[6].Size + -1) * 4);
  }
  pvVar1 = *local_38;
  this_00 = (ImDrawList *)local_38[1];
  if (in_RDI->Size < 1) {
    local_40 = (ImDrawCmd *)0x0;
  }
  else {
    local_40 = in_RDI->Data + (in_RDI->Size + -1);
  }
  if (local_40 != (ImDrawCmd *)0x0) {
    local_18 = (char)pvVar1;
    cStackY_17 = (char)((ulong)pvVar1 >> 8);
    cStackY_16 = (char)((ulong)pvVar1 >> 0x10);
    cStackY_15 = (char)((ulong)pvVar1 >> 0x18);
    cStackY_14 = (char)((ulong)pvVar1 >> 0x20);
    cStackY_13 = (char)((ulong)pvVar1 >> 0x28);
    cStackY_12 = (char)((ulong)pvVar1 >> 0x30);
    cStackY_11 = (char)((ulong)pvVar1 >> 0x38);
    cVar24 = (char)((ulong)this_00 >> 8);
    cVar26 = (char)((ulong)this_00 >> 0x10);
    cVar28 = (char)((ulong)this_00 >> 0x18);
    cVar30 = (char)((ulong)this_00 >> 0x20);
    cVar32 = (char)((ulong)this_00 >> 0x28);
    cVar34 = (char)((ulong)this_00 >> 0x30);
    cVar36 = (char)((ulong)this_00 >> 0x38);
    if (local_40->ElemCount != 0) {
      cVar14 = -(*(char *)&(local_40->ClipRect).x == local_18);
      cVar15 = -(*(char *)((long)&(local_40->ClipRect).x + 1) == cStackY_17);
      cVar16 = -(*(char *)((long)&(local_40->ClipRect).x + 2) == cStackY_16);
      cVar17 = -(*(char *)((long)&(local_40->ClipRect).x + 3) == cStackY_15);
      cVar18 = -(*(char *)&(local_40->ClipRect).y == cStackY_14);
      cVar19 = -(*(char *)((long)&(local_40->ClipRect).y + 1) == cStackY_13);
      cVar20 = -(*(char *)((long)&(local_40->ClipRect).y + 2) == cStackY_12);
      cVar21 = -(*(char *)((long)&(local_40->ClipRect).y + 3) == cStackY_11);
      cVar22 = -(*(char *)&(local_40->ClipRect).z == (char)this_00);
      cVar23 = -(*(char *)((long)&(local_40->ClipRect).z + 1) == cVar24);
      cVar25 = -(*(char *)((long)&(local_40->ClipRect).z + 2) == cVar26);
      cVar27 = -(*(char *)((long)&(local_40->ClipRect).z + 3) == cVar28);
      cVar29 = -(*(char *)&(local_40->ClipRect).w == cVar30);
      cVar31 = -(*(char *)((long)&(local_40->ClipRect).w + 1) == cVar32);
      cVar33 = -(*(char *)((long)&(local_40->ClipRect).w + 2) == cVar34);
      bVar35 = -(*(char *)((long)&(local_40->ClipRect).w + 3) == cVar36);
      auVar2[1] = cVar15;
      auVar2[0] = cVar14;
      auVar2[2] = cVar16;
      auVar2[3] = cVar17;
      auVar2[4] = cVar18;
      auVar2[5] = cVar19;
      auVar2[6] = cVar20;
      auVar2[7] = cVar21;
      auVar2[8] = cVar22;
      auVar2[9] = cVar23;
      auVar2[10] = cVar25;
      auVar2[0xb] = cVar27;
      auVar2[0xc] = cVar29;
      auVar2[0xd] = cVar31;
      auVar2[0xe] = cVar33;
      auVar2[0xf] = bVar35;
      auVar3[1] = cVar15;
      auVar3[0] = cVar14;
      auVar3[2] = cVar16;
      auVar3[3] = cVar17;
      auVar3[4] = cVar18;
      auVar3[5] = cVar19;
      auVar3[6] = cVar20;
      auVar3[7] = cVar21;
      auVar3[8] = cVar22;
      auVar3[9] = cVar23;
      auVar3[10] = cVar25;
      auVar3[0xb] = cVar27;
      auVar3[0xc] = cVar29;
      auVar3[0xd] = cVar31;
      auVar3[0xe] = cVar33;
      auVar3[0xf] = bVar35;
      auVar12[1] = cVar17;
      auVar12[0] = cVar16;
      auVar12[2] = cVar18;
      auVar12[3] = cVar19;
      auVar12[4] = cVar20;
      auVar12[5] = cVar21;
      auVar12[6] = cVar22;
      auVar12[7] = cVar23;
      auVar12[8] = cVar25;
      auVar12[9] = cVar27;
      auVar12[10] = cVar29;
      auVar12[0xb] = cVar31;
      auVar12[0xc] = cVar33;
      auVar12[0xd] = bVar35;
      auVar10[1] = cVar18;
      auVar10[0] = cVar17;
      auVar10[2] = cVar19;
      auVar10[3] = cVar20;
      auVar10[4] = cVar21;
      auVar10[5] = cVar22;
      auVar10[6] = cVar23;
      auVar10[7] = cVar25;
      auVar10[8] = cVar27;
      auVar10[9] = cVar29;
      auVar10[10] = cVar31;
      auVar10[0xb] = cVar33;
      auVar10[0xc] = bVar35;
      auVar8[1] = cVar19;
      auVar8[0] = cVar18;
      auVar8[2] = cVar20;
      auVar8[3] = cVar21;
      auVar8[4] = cVar22;
      auVar8[5] = cVar23;
      auVar8[6] = cVar25;
      auVar8[7] = cVar27;
      auVar8[8] = cVar29;
      auVar8[9] = cVar31;
      auVar8[10] = cVar33;
      auVar8[0xb] = bVar35;
      auVar6[1] = cVar20;
      auVar6[0] = cVar19;
      auVar6[2] = cVar21;
      auVar6[3] = cVar22;
      auVar6[4] = cVar23;
      auVar6[5] = cVar25;
      auVar6[6] = cVar27;
      auVar6[7] = cVar29;
      auVar6[8] = cVar31;
      auVar6[9] = cVar33;
      auVar6[10] = bVar35;
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar35,CONCAT18(cVar33,CONCAT17(cVar31,CONCAT16(cVar29,
                                                  CONCAT15(cVar27,CONCAT14(cVar25,CONCAT13(cVar23,
                                                  CONCAT12(cVar22,CONCAT11(cVar21,cVar20))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar35,CONCAT17(cVar33,CONCAT16(cVar31,CONCAT15(cVar29,
                                                  CONCAT14(cVar27,CONCAT13(cVar25,CONCAT12(cVar23,
                                                  CONCAT11(cVar22,cVar21)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar35 >> 7) << 0xf) != 0xffff) goto LAB_0015b184;
    }
    if (local_40->UserCallback == (ImDrawCallback)0x0) {
      if (in_RDI->Size < 2) {
        local_48 = (ImDrawCmd *)0x0;
      }
      else {
        local_48 = local_40 + -1;
      }
      if ((local_40->ElemCount == 0) && (local_48 != (ImDrawCmd *)0x0)) {
        cVar14 = -(*(char *)&(local_48->ClipRect).x == local_18);
        cVar15 = -(*(char *)((long)&(local_48->ClipRect).x + 1) == cStackY_17);
        cVar16 = -(*(char *)((long)&(local_48->ClipRect).x + 2) == cStackY_16);
        cVar17 = -(*(char *)((long)&(local_48->ClipRect).x + 3) == cStackY_15);
        cVar18 = -(*(char *)&(local_48->ClipRect).y == cStackY_14);
        cVar19 = -(*(char *)((long)&(local_48->ClipRect).y + 1) == cStackY_13);
        cVar20 = -(*(char *)((long)&(local_48->ClipRect).y + 2) == cStackY_12);
        cVar21 = -(*(char *)((long)&(local_48->ClipRect).y + 3) == cStackY_11);
        cVar22 = -(*(char *)&(local_48->ClipRect).z == (char)this_00);
        cVar24 = -(*(char *)((long)&(local_48->ClipRect).z + 1) == cVar24);
        cVar26 = -(*(char *)((long)&(local_48->ClipRect).z + 2) == cVar26);
        cVar28 = -(*(char *)((long)&(local_48->ClipRect).z + 3) == cVar28);
        cVar30 = -(*(char *)&(local_48->ClipRect).w == cVar30);
        cVar32 = -(*(char *)((long)&(local_48->ClipRect).w + 1) == cVar32);
        cVar34 = -(*(char *)((long)&(local_48->ClipRect).w + 2) == cVar34);
        bVar35 = -(*(char *)((long)&(local_48->ClipRect).w + 3) == cVar36);
        auVar4[1] = cVar15;
        auVar4[0] = cVar14;
        auVar4[2] = cVar16;
        auVar4[3] = cVar17;
        auVar4[4] = cVar18;
        auVar4[5] = cVar19;
        auVar4[6] = cVar20;
        auVar4[7] = cVar21;
        auVar4[8] = cVar22;
        auVar4[9] = cVar24;
        auVar4[10] = cVar26;
        auVar4[0xb] = cVar28;
        auVar4[0xc] = cVar30;
        auVar4[0xd] = cVar32;
        auVar4[0xe] = cVar34;
        auVar4[0xf] = bVar35;
        auVar5[1] = cVar15;
        auVar5[0] = cVar14;
        auVar5[2] = cVar16;
        auVar5[3] = cVar17;
        auVar5[4] = cVar18;
        auVar5[5] = cVar19;
        auVar5[6] = cVar20;
        auVar5[7] = cVar21;
        auVar5[8] = cVar22;
        auVar5[9] = cVar24;
        auVar5[10] = cVar26;
        auVar5[0xb] = cVar28;
        auVar5[0xc] = cVar30;
        auVar5[0xd] = cVar32;
        auVar5[0xe] = cVar34;
        auVar5[0xf] = bVar35;
        auVar13[1] = cVar17;
        auVar13[0] = cVar16;
        auVar13[2] = cVar18;
        auVar13[3] = cVar19;
        auVar13[4] = cVar20;
        auVar13[5] = cVar21;
        auVar13[6] = cVar22;
        auVar13[7] = cVar24;
        auVar13[8] = cVar26;
        auVar13[9] = cVar28;
        auVar13[10] = cVar30;
        auVar13[0xb] = cVar32;
        auVar13[0xc] = cVar34;
        auVar13[0xd] = bVar35;
        auVar11[1] = cVar18;
        auVar11[0] = cVar17;
        auVar11[2] = cVar19;
        auVar11[3] = cVar20;
        auVar11[4] = cVar21;
        auVar11[5] = cVar22;
        auVar11[6] = cVar24;
        auVar11[7] = cVar26;
        auVar11[8] = cVar28;
        auVar11[9] = cVar30;
        auVar11[10] = cVar32;
        auVar11[0xb] = cVar34;
        auVar11[0xc] = bVar35;
        auVar9[1] = cVar19;
        auVar9[0] = cVar18;
        auVar9[2] = cVar20;
        auVar9[3] = cVar21;
        auVar9[4] = cVar22;
        auVar9[5] = cVar24;
        auVar9[6] = cVar26;
        auVar9[7] = cVar28;
        auVar9[8] = cVar30;
        auVar9[9] = cVar32;
        auVar9[10] = cVar34;
        auVar9[0xb] = bVar35;
        auVar7[1] = cVar20;
        auVar7[0] = cVar19;
        auVar7[2] = cVar21;
        auVar7[3] = cVar22;
        auVar7[4] = cVar24;
        auVar7[5] = cVar26;
        auVar7[6] = cVar28;
        auVar7[7] = cVar30;
        auVar7[8] = cVar32;
        auVar7[9] = cVar34;
        auVar7[10] = bVar35;
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar9 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar35,CONCAT18(cVar34,CONCAT17(cVar32,CONCAT16(cVar30
                                                  ,CONCAT15(cVar28,CONCAT14(cVar26,CONCAT13(cVar24,
                                                  CONCAT12(cVar22,CONCAT11(cVar21,cVar20))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar35,CONCAT17(cVar34,CONCAT16(cVar32,CONCAT15(cVar30
                                                  ,CONCAT14(cVar28,CONCAT13(cVar26,CONCAT12(cVar24,
                                                  CONCAT11(cVar22,cVar21)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar35 >> 7) << 0xf) == 0xffff) {
          if (in_RDI[7].Size == 0) {
            local_58 = (ImTextureID)0x0;
          }
          else {
            local_58 = *(ImTextureID *)
                        (&(in_RDI[7].Data)->ElemCount + (long)(in_RDI[7].Size + -1) * 2);
          }
          if ((local_48->TextureId == local_58) && (local_48->UserCallback == (ImDrawCallback)0x0))
          {
            ImVector<ImDrawCmd>::pop_back(in_RDI);
            return;
          }
        }
      }
      *(ImTextureID *)&local_40->ClipRect = pvVar1;
      *(ImDrawList **)&(local_40->ClipRect).z = this_00;
      return;
    }
  }
LAB_0015b184:
  AddDrawCmd(this_00);
  return;
}

Assistant:

void ImDrawList::UpdateClipRect()
{
    // If current command is used with different settings we need to add a new command
    const ImVec4 curr_clip_rect = GetCurrentClipRect();
    ImDrawCmd* curr_cmd = CmdBuffer.Size > 0 ? &CmdBuffer.Data[CmdBuffer.Size-1] : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) != 0) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && memcmp(&prev_cmd->ClipRect, &curr_clip_rect, sizeof(ImVec4)) == 0 && prev_cmd->TextureId == GetCurrentTextureId() && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->ClipRect = curr_clip_rect;
}